

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_taproot.cpp
# Opt level: O0

ByteData256 * __thiscall
cfd::core::TapBranch::GetBranchHash
          (ByteData256 *__return_storage_ptr__,TapBranch *this,uint8_t depth)

{
  bool bVar1;
  int iVar2;
  HashUtil *pHVar3;
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *in_stack_fffffffffffffe18
  ;
  HashUtil *in_stack_fffffffffffffe20;
  HashUtil *in_stack_fffffffffffffe30;
  ByteData256 local_190;
  ByteData256 local_178;
  uchar *local_160;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_158;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_150;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_148;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_140;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_128;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *hash_bytes;
  vector<unsigned_char,_std::allocator<unsigned_char>_> **local_108;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *node_bytes;
  undefined1 local_d8 [8];
  HashUtil hasher;
  ByteData256 *node;
  iterator __end2;
  iterator __begin2;
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *__range2;
  undefined1 local_88 [7];
  uint8_t index;
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> nodes;
  ByteData tapbranch_base;
  allocator local_41;
  string local_40 [32];
  undefined4 local_20;
  byte local_1a;
  byte local_19;
  TapBranch *pTStack_18;
  uint8_t depth_local;
  TapBranch *this_local;
  ByteData256 *hash;
  
  local_1a = 0;
  local_19 = depth;
  pTStack_18 = this;
  this_local = (TapBranch *)__return_storage_ptr__;
  GetBaseHash(__return_storage_ptr__,this);
  bVar1 = ::std::vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>::empty
                    (&this->branch_list_);
  if (bVar1) {
    local_1a = 1;
    local_20 = 1;
  }
  else {
    if ((GetBranchHash(unsigned_char)::kTaggedHash == '\0') &&
       (iVar2 = __cxa_guard_acquire(&GetBranchHash(unsigned_char)::kTaggedHash), iVar2 != 0)) {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_40,"TapBranch",&local_41);
      HashUtil::Sha256(&GetBranchHash::kTaggedHash,(string *)local_40);
      ::std::__cxx11::string::~string(local_40);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_41);
      __cxa_atexit(ByteData256::~ByteData256,&GetBranchHash::kTaggedHash,&__dso_handle);
      __cxa_guard_release(&GetBranchHash(unsigned_char)::kTaggedHash);
    }
    ByteData256::Concat<cfd::core::ByteData256>
              ((ByteData *)
               &nodes.
                super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,&GetBranchHash::kTaggedHash,
               &GetBranchHash::kTaggedHash);
    (*this->_vptr_TapBranch[4])(local_88);
    __range2._7_1_ = 0;
    __end2 = ::std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::begin
                       (in_stack_fffffffffffffe18);
    ::std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::end
              (in_stack_fffffffffffffe18);
    while ((bVar1 = __gnu_cxx::operator!=
                              ((__normal_iterator<cfd::core::ByteData256_*,_std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>_>
                                *)in_stack_fffffffffffffe20,
                               (__normal_iterator<cfd::core::ByteData256_*,_std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>_>
                                *)in_stack_fffffffffffffe18), bVar1 &&
           (hasher.buffer_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage =
                 (pointer)__gnu_cxx::
                          __normal_iterator<cfd::core::ByteData256_*,_std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>_>
                          ::operator*(&__end2), __range2._7_1_ <= local_19))) {
      HashUtil::HashUtil((HashUtil *)&node_bytes,'\x03');
      pHVar3 = HashUtil::operator<<
                         ((HashUtil *)&node_bytes,
                          (ByteData *)
                          &nodes.
                           super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
      HashUtil::HashUtil((HashUtil *)local_d8,pHVar3);
      HashUtil::~HashUtil((HashUtil *)&node_bytes);
      ByteData256::GetBytes
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&hash_bytes,
                 (ByteData256 *)
                 hasher.buffer_.data_.
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage);
      local_108 = &hash_bytes;
      ByteData256::GetBytes(&local_140,__return_storage_ptr__);
      local_128 = &local_140;
      local_148._M_current =
           (uchar *)::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                               in_stack_fffffffffffffe18);
      local_150._M_current =
           (uchar *)::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                               in_stack_fffffffffffffe18);
      local_158._M_current =
           (uchar *)::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                               in_stack_fffffffffffffe18);
      local_160 = (uchar *)::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                      in_stack_fffffffffffffe18);
      bVar1 = ::std::
              lexicographical_compare<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                        (local_148,local_150,local_158,
                         (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                          )local_160);
      if (bVar1) {
        pHVar3 = HashUtil::operator<<((HashUtil *)local_d8,__return_storage_ptr__);
        in_stack_fffffffffffffe30 =
             HashUtil::operator<<
                       (pHVar3,(ByteData256 *)
                               hasher.buffer_.data_.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage);
        HashUtil::Output256(&local_178,in_stack_fffffffffffffe30);
        ByteData256::operator=(__return_storage_ptr__,&local_178);
        ByteData256::~ByteData256((ByteData256 *)0x490b0c);
      }
      else {
        pHVar3 = HashUtil::operator<<
                           ((HashUtil *)local_d8,
                            (ByteData256 *)
                            hasher.buffer_.data_.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage);
        in_stack_fffffffffffffe20 = HashUtil::operator<<(pHVar3,__return_storage_ptr__);
        HashUtil::Output256(&local_190,in_stack_fffffffffffffe20);
        ByteData256::operator=(__return_storage_ptr__,&local_190);
        ByteData256::~ByteData256((ByteData256 *)0x490bea);
      }
      __range2._7_1_ = __range2._7_1_ + 1;
      ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffe30)
      ;
      ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffe30)
      ;
      HashUtil::~HashUtil((HashUtil *)local_d8);
      __gnu_cxx::
      __normal_iterator<cfd::core::ByteData256_*,_std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>_>
      ::operator++(&__end2);
    }
    local_1a = 1;
    local_20 = 1;
    ::std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
              ((vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *)
               in_stack_fffffffffffffe30);
    ByteData::~ByteData((ByteData *)0x490c64);
  }
  if ((local_1a & 1) == 0) {
    ByteData256::~ByteData256((ByteData256 *)0x490c8c);
  }
  return __return_storage_ptr__;
}

Assistant:

ByteData256 TapBranch::GetBranchHash(uint8_t depth) const {
  ByteData256 hash = GetBaseHash();
  if (branch_list_.empty()) return hash;

  static auto kTaggedHash = HashUtil::Sha256("TapBranch");
  ByteData tapbranch_base = kTaggedHash.Concat(kTaggedHash);
  auto nodes = GetNodeList();
  uint8_t index = 0;
  for (const auto& node : nodes) {
    if (index > depth) break;
    auto hasher = HashUtil(HashUtil::kSha256) << tapbranch_base;
    const auto& node_bytes = node.GetBytes();
    const auto& hash_bytes = hash.GetBytes();
    if (std::lexicographical_compare(
            hash_bytes.begin(), hash_bytes.end(), node_bytes.begin(),
            node_bytes.end())) {
      hash = (hasher << hash << node).Output256();
    } else {
      hash = (hasher << node << hash).Output256();
    }
    ++index;
  }
  return hash;
}